

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  pointer pcVar1;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  char local_50 [16];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  size_t local_20;
  int local_18;
  
  local_70._0_8_ = &PTR__FieldBase_00325880;
  local_70._8_4_ = 8;
  local_60._M_p = local_50;
  pcVar1 = (beginString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + beginString->_M_string_length);
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_20 = 0;
  local_18 = 0;
  local_70._0_8_ = &PTR__FieldBase_00326268;
  *(undefined4 *)(this + 0x18) = local_70._8_4_;
  std::__cxx11::string::_M_assign((string *)(this + 0x20));
  *(int *)(this + 0x68) = local_18;
  *(size_t *)(this + 0x60) = local_20;
  *(undefined8 *)(this + 0x48) = 0;
  **(undefined1 **)(this + 0x40) = 0;
  FieldBase::~FieldBase((FieldBase *)local_70);
  this[8] = (DataDictionary)0x1;
  return;
}

Assistant:

void setVersion( const std::string& beginString )
  {
    m_beginString = beginString;
    m_hasVersion = true;
  }